

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

HighsInt __thiscall
HighsOrbitopeMatrix::getBranchingColumn
          (HighsOrbitopeMatrix *this,vector<double,_std::allocator<double>_> *colLower,
          vector<double,_std::allocator<double>_> *colUpper,HighsInt col)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  int *piVar5;
  long lVar6;
  u8 meta;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_35;
  int local_34;
  u64 local_30;
  u64 local_28;
  u64 local_20;
  
  local_34 = col;
  bVar4 = HighsHashTable<int,_int>::findPosition
                    (&this->columnToRow,&local_34,&local_35,&local_20,&local_28,&local_30);
  if (((bVar4) &&
      (iVar3 = *(int *)((long)((this->columnToRow).entries._M_t.
                               super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
                               .super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>.
                               _M_head_impl + local_30) + 4),
      (this->rowIsSetPacking).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[iVar3] != '\0')) &&
     (lVar6 = (long)this->rowLength, 0 < lVar6)) {
    piVar5 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + iVar3;
    do {
      iVar3 = *piVar5;
      if (iVar3 == local_34) {
        return local_34;
      }
      dVar2 = (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      pdVar1 = (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start + iVar3;
      if (dVar2 != *pdVar1) {
        return iVar3;
      }
      if (NAN(dVar2) || NAN(*pdVar1)) {
        return iVar3;
      }
      piVar5 = piVar5 + this->numRows;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return local_34;
}

Assistant:

HighsInt HighsOrbitopeMatrix::getBranchingColumn(
    const std::vector<double>& colLower, const std::vector<double>& colUpper,
    HighsInt col) const {
  const HighsInt* i = columnToRow.find(col);
  if (i && rowIsSetPacking[*i]) {
    for (HighsInt j = 0; j < rowLength; ++j) {
      HighsInt branchCol = entry(*i, j);
      if (branchCol == col) break;
      if (colLower[branchCol] != colUpper[branchCol]) return branchCol;
    }
  }

  return col;
}